

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

value_type *
winmd::reader::ElemSig::read_enum
          (value_type *__return_storage_ptr__,ElementType type,byte_view *data)

{
  bool bVar1;
  byte bVar2;
  ushort uVar3;
  char16_t cVar4;
  unsigned_short uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined7 in_register_00000031;
  byte_view *cursor;
  uint uVar10;
  allocator<char> local_29;
  string local_28;
  
  cursor = (byte_view *)CONCAT71(in_register_00000031,type);
  switch((int)__return_storage_ptr__) {
  case 2:
    bVar1 = read<bool>(cursor);
    uVar7 = (ulong)bVar1;
    break;
  case 3:
    cVar4 = read<char16_t>(cursor);
    uVar7 = (ulong)(ushort)cVar4;
    uVar9 = (uint)((ushort)cVar4 >> 8);
    goto LAB_001442dc;
  case 4:
    bVar2 = read<signed_char>(cursor);
    uVar7 = (ulong)bVar2;
    break;
  case 5:
    bVar2 = read<unsigned_char>(cursor);
    uVar7 = (ulong)bVar2;
    break;
  case 6:
    uVar3 = read<short>(cursor);
    uVar7 = (ulong)uVar3;
    uVar9 = (uint)(uVar3 >> 8);
    goto LAB_001442dc;
  case 7:
    uVar5 = read<unsigned_short>(cursor);
    uVar7 = (ulong)uVar5;
    uVar9 = (uint)(uVar5 >> 8);
LAB_001442dc:
    uVar8 = 0;
    uVar10 = 0;
    goto LAB_0014431b;
  case 8:
    uVar6 = read<int>(cursor);
    goto LAB_001442f4;
  case 9:
    uVar6 = read<unsigned_int>(cursor);
LAB_001442f4:
    uVar10 = uVar6 >> 0x10;
    uVar9 = uVar6 >> 8;
    uVar7 = (ulong)uVar6;
    uVar8 = 0;
    goto LAB_0014431b;
  case 10:
    uVar7 = read<long>(cursor);
    uVar9 = (uint)uVar7 >> 8;
    uVar10 = (uint)(uVar7 >> 0x10);
    uVar8 = uVar7 & 0xffffffff00000000;
    goto LAB_0014431b;
  case 0xb:
    uVar7 = read<unsigned_long>(cursor);
    uVar9 = (uint)uVar7 >> 8;
    uVar10 = (uint)(uVar7 >> 0x10);
    uVar8 = uVar7 & 0xffffffff00000000;
    goto LAB_0014431b;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"Invalid underling enum type encountered",&local_29);
    impl::throw_invalid(&local_28);
  }
  uVar8 = 0;
  uVar10 = 0;
  uVar9 = 0;
LAB_0014431b:
  return (value_type *)(((uint)uVar7 & 0xff | (uVar9 & 0xff) << 8 | uVar10 << 0x10) | uVar8);
}

Assistant:

static EnumValue::value_type read_enum(ElementType type, byte_view& data)
        {
            switch (type)
            {
            case ElementType::Boolean:
                return read<bool>(data);

            case ElementType::Char:
                return read<char16_t>(data);

            case ElementType::I1:
                return read<int8_t>(data);

            case ElementType::U1:
                return read<uint8_t>(data);

            case ElementType::I2:
                return read<int16_t>(data);

            case ElementType::U2:
                return read<uint16_t>(data);

            case ElementType::I4:
                return read<int32_t>(data);

            case ElementType::U4:
                return read<uint32_t>(data);

            case ElementType::I8:
                return read<int64_t>(data);

            case ElementType::U8:
                return read<uint64_t>(data);

            default:
                impl::throw_invalid("Invalid underling enum type encountered");
            }
        }